

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O3

double eval_arg<double>(char *s,double min,double max)

{
  istream *piVar1;
  runtime_error *this;
  double value;
  istringstream in;
  allocator<char> local_1c9;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  local_1c8 = min;
  local_1c0 = max;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,s,&local_1c9);
  std::__cxx11::istringstream::istringstream(local_190,(string *)local_1b0,_S_in);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  piVar1 = std::istream::_M_extract<double>((double *)local_190);
  if (((((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) &&
      (local_1c8 <= local_1b8)) && (local_1b8 <= local_1c0)) {
    local_1c8 = local_1b8;
    std::__cxx11::istringstream::~istringstream(local_190);
    std::ios_base::~ios_base(local_118);
    return local_1c8;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid value");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T eval_arg(const char* s, T min, T max)
{
    T value;
    std::istringstream in{s};

    if (!(in >> value) || value < min || value > max)
        throw std::runtime_error("invalid value");

    return value;
}